

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffexts(char *extspec,int *extnum,char *extname,int *extvers,int *hdutype,char *imagecolname,
          char *rowexpress,int *status)

{
  int iVar1;
  ushort **ppuVar2;
  int *piVar3;
  long lVar4;
  size_t sVar5;
  undefined4 *in_RCX;
  char *in_RDX;
  int *in_RSI;
  char *in_RDI;
  undefined4 *in_R8;
  char *in_R9;
  bool bVar6;
  char *loc;
  char tmpname [71];
  int notint;
  int nvals;
  int slen;
  char *ptr2;
  char *ptr1;
  char *in_stack_ffffffffffffff50;
  char local_a8 [84];
  int local_54;
  int local_50;
  int local_4c;
  char *local_48;
  char *local_40;
  char *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  char *local_20;
  int *local_18;
  
  local_54 = 1;
  *in_RSI = 0;
  *in_RDX = '\0';
  *in_RCX = 0;
  *in_R8 = 0xffffffff;
  *in_R9 = '\0';
  *loc = '\0';
  local_40 = in_RDI;
  if (0 < *(int *)tmpname._0_8_) {
    return *(int *)tmpname._0_8_;
  }
  for (; *local_40 == ' '; local_40 = local_40 + 1) {
  }
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[(int)*local_40] & 0x800) != 0) {
    local_54 = 0;
    piVar3 = __errno_location();
    *piVar3 = 0;
    lVar4 = strtol(local_40,(char **)&stack0xffffffffffffff50,10);
    *local_18 = (int)lVar4;
    for (; *in_stack_ffffffffffffff50 == ' ';
        in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 + 1) {
    }
    if (((*in_stack_ffffffffffffff50 != '\0') && (*in_stack_ffffffffffffff50 != ';')) ||
       (piVar3 = __errno_location(), *piVar3 == 0x22)) {
      *local_18 = 0;
      local_54 = 1;
      piVar3 = __errno_location();
      *piVar3 = 0;
    }
    if ((*local_18 < 0) || (99999 < *local_18)) {
      *local_18 = 0;
      ffpmsg((char *)0x108678);
      ffpmsg((char *)0x108685);
      *(undefined4 *)tmpname._0_8_ = 0x7d;
      return 0x7d;
    }
  }
  if (local_54 != 0) {
    sVar5 = strcspn(local_40,",:;");
    local_4c = (int)sVar5;
    if (0x46 < local_4c) {
      *(undefined4 *)tmpname._0_8_ = 0x7d;
      return 0x7d;
    }
    strncat(local_20,local_40,(long)local_4c);
    while( true ) {
      bVar6 = false;
      if (0 < local_4c) {
        bVar6 = local_20[(long)local_4c + -1] == ' ';
      }
      if (!bVar6) break;
      local_20[(long)local_4c + -1] = '\0';
      local_4c = local_4c + -1;
    }
    local_40 = local_40 + local_4c;
    sVar5 = strspn(local_40," ,:");
    local_4c = (int)sVar5;
    local_40 = local_40 + local_4c;
    sVar5 = strcspn(local_40," ,:;");
    local_4c = (int)sVar5;
    if (local_4c == 0) {
      strcpy(local_a8,local_20);
      ffupch(in_stack_ffffffffffffff50);
      iVar1 = strcmp(local_a8,"PRIMARY");
      if ((iVar1 == 0) || (iVar1 = strcmp(local_a8,"P"), iVar1 == 0)) {
        *local_20 = '\0';
      }
    }
    else {
      local_50 = __isoc99_sscanf(local_40,"%d",local_28);
      if (local_50 != 1) {
        ffpmsg((char *)0x1087e2);
        ffpmsg((char *)0x1087ef);
        *(undefined4 *)tmpname._0_8_ = 0x7d;
        return 0x7d;
      }
      local_40 = local_40 + local_4c;
      sVar5 = strspn(local_40," ,:");
      local_4c = (int)sVar5;
      local_40 = local_40 + local_4c;
      sVar5 = strcspn(local_40,";");
      local_4c = (int)sVar5;
      if (local_4c != 0) {
        if ((*local_40 == 'b') || (*local_40 == 'B')) {
          *local_30 = 2;
        }
        else if ((((*local_40 == 't') || (*local_40 == 'T')) || (*local_40 == 'a')) ||
                (*local_40 == 'A')) {
          *local_30 = 1;
        }
        else {
          if ((*local_40 != 'i') && (*local_40 != 'I')) {
            ffpmsg((char *)0x108911);
            ffpmsg((char *)0x10891e);
            *(undefined4 *)tmpname._0_8_ = 0x7d;
            return 0x7d;
          }
          *local_30 = 0;
        }
      }
    }
  }
  local_40 = strchr(local_40,0x3b);
  if (local_40 != (char *)0x0) {
    do {
      local_40 = local_40 + 1;
    } while (*local_40 == ' ');
    local_48 = strchr(local_40,0x28);
    if (local_48 == (char *)0x0) {
      ffpmsg((char *)0x108a0e);
      ffpmsg((char *)0x108a1a);
      ffpmsg((char *)0x108a27);
      *(undefined4 *)tmpname._0_8_ = 0x7d;
      return 0x7d;
    }
    if (0x400 < (long)local_48 - (long)local_40) {
      *(undefined4 *)tmpname._0_8_ = 0x7d;
      return 0x7d;
    }
    strncat(local_38,local_40,(long)local_48 - (long)local_40);
    do {
      local_48 = local_48 + 1;
    } while (*local_48 == ' ');
    local_40 = strchr(local_48,0x29);
    if (local_40 == (char *)0x0) {
      ffpmsg((char *)0x108aea);
      ffpmsg((char *)0x108af6);
      ffpmsg((char *)0x108b03);
      *(undefined4 *)tmpname._0_8_ = 0x7d;
      return 0x7d;
    }
    if (0x400 < (long)local_40 - (long)local_48) {
      *(undefined4 *)tmpname._0_8_ = 0x7d;
      return 0x7d;
    }
    strncat(loc,local_48,(long)local_40 - (long)local_48);
  }
  return *(int *)tmpname._0_8_;
}

Assistant:

int ffexts(char *extspec, 
                       int *extnum, 
                       char *extname,
                       int *extvers,
                       int *hdutype,
                       char *imagecolname,
                       char *rowexpress,
                       int *status)
{
/*
   Parse the input extension specification string, returning either the
   extension number or the values of the EXTNAME, EXTVERS, and XTENSION
   keywords in desired extension. Also return the name of the column containing
   an image, and an expression to be used to determine which row to use,
   if present.
*/
    char *ptr1, *ptr2;
    int slen, nvals;
    int notint = 1; /* initially assume specified extname is not an integer */
    char tmpname[FLEN_VALUE], *loc;

    *extnum = 0;
    *extname = '\0';
    *extvers = 0;
    *hdutype = ANY_HDU;
    *imagecolname = '\0';
    *rowexpress = '\0';

    if (*status > 0)
        return(*status);

    ptr1 = extspec;       /* pointer to first char */

    while (*ptr1 == ' ')  /* skip over any leading blanks */
        ptr1++;

    if (isdigit((int) *ptr1))  /* is the extension specification a number? */
    {
        notint = 0;  /* looks like extname may actually be the ext. number */
        errno = 0;  /* reset this prior to calling strtol */
        *extnum = strtol(ptr1, &loc, 10);  /* read the string as an integer */

        while (*loc == ' ')  /* skip over trailing blanks */
           loc++;

        /* check for read error, or junk following the integer */
        if ((*loc != '\0' && *loc != ';' ) || (errno == ERANGE) )
        {
           *extnum = 0;
           notint = 1;  /* no, extname was not a simple integer after all */
           errno = 0;  /* reset error condition flag if it was set */
        }

        if ( *extnum < 0 || *extnum > 99999)
        {
            *extnum = 0;   /* this is not a reasonable extension number */
            ffpmsg("specified extension number is out of range:");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR); 
        }
    }


/*  This logic was too simple, and failed on extnames like '1000TEMP' 
    where it would try to move to the 1000th extension

    if (isdigit((int) *ptr1))  
    {
        sscanf(ptr1, "%d", extnum);
        if (*extnum < 0 || *extnum > 9999)
        {
            *extnum = 0;   
            ffpmsg("specified extension number is out of range:");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR); 
        }
    }
*/

    if (notint)
    {
           /* not a number, so EXTNAME must be specified, followed by */
           /* optional EXTVERS and XTENSION  values */

           /* don't use space char as end indicator, because there */
           /* may be imbedded spaces in the EXTNAME value */
           slen = strcspn(ptr1, ",:;");   /* length of EXTNAME */

	   if (slen > FLEN_VALUE - 1)
	   {
                return(*status = URL_PARSE_ERROR); 
           }
 
           strncat(extname, ptr1, slen);  /* EXTNAME value */

           /* now remove any trailing blanks */
           while (slen > 0 && *(extname + slen -1) == ' ')
           {
               *(extname + slen -1) = '\0';
               slen--;
           }

           ptr1 += slen;
           slen = strspn(ptr1, " ,:");  /* skip delimiter characters */
           ptr1 += slen;

           slen = strcspn(ptr1, " ,:;");   /* length of EXTVERS */
           if (slen)
           {
               nvals = sscanf(ptr1, "%d", extvers);  /* EXTVERS value */
               if (nvals != 1)
               {
                   ffpmsg("illegal EXTVER value in input URL:");
                   ffpmsg(extspec);
                   return(*status = URL_PARSE_ERROR);
               }

               ptr1 += slen;
               slen = strspn(ptr1, " ,:");  /* skip delimiter characters */
               ptr1 += slen;

               slen = strcspn(ptr1, ";");   /* length of HDUTYPE */
               if (slen)
               {
                 if (*ptr1 == 'b' || *ptr1 == 'B')
                     *hdutype = BINARY_TBL;  
                 else if (*ptr1 == 't' || *ptr1 == 'T' ||
                          *ptr1 == 'a' || *ptr1 == 'A')
                     *hdutype = ASCII_TBL;
                 else if (*ptr1 == 'i' || *ptr1 == 'I')
                     *hdutype = IMAGE_HDU;
                 else
                 {
                     ffpmsg("unknown type of HDU in input URL:");
                     ffpmsg(extspec);
                     return(*status = URL_PARSE_ERROR);
                 }
               }
           }
           else
           {
                strcpy(tmpname, extname);
                ffupch(tmpname);
                if (!strcmp(tmpname, "PRIMARY") || !strcmp(tmpname, "P") )
                    *extname = '\0';  /* return extnum = 0 */
           }
    }

    ptr1 = strchr(ptr1, ';');
    if (ptr1)
    {
        /* an image is to be opened; the image is contained in a single */
        /* cell of a binary table.  A column name and an expression to  */
        /* determine which row to use has been entered.                 */

        ptr1++;  /* skip over the ';' delimiter */
        while (*ptr1 == ' ')  /* skip over any leading blanks */
            ptr1++;

        ptr2 = strchr(ptr1, '(');
        if (!ptr2)
        {
            ffpmsg("illegal specification of image in table cell in input URL:");
            ffpmsg(" did not find a row expression enclosed in ( )");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR);
        }

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
	{
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(imagecolname, ptr1, ptr2 - ptr1); /* copy column name */

        ptr2++;  /* skip over the '(' delimiter */
        while (*ptr2 == ' ')  /* skip over any leading blanks */
            ptr2++;


        ptr1 = strchr(ptr2, ')');
        if (!ptr1)
        {
            ffpmsg("illegal specification of image in table cell in input URL:");
            ffpmsg(" missing closing ')' character in row expression");
            ffpmsg(extspec);
            return(*status = URL_PARSE_ERROR);
        }

	if (ptr1 - ptr2 > FLEN_FILENAME - 1)
        {
                return(*status = URL_PARSE_ERROR); 
        }
 
        strncat(rowexpress, ptr2, ptr1 - ptr2); /* row expression */
    }

    return(*status);
}